

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O2

void __thiscall Ui_InitGameDialog::retranslateUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  QLabel *pQVar1;
  QArrayDataPointer<char16_t> local_30;
  
  QCoreApplication::translate((char *)&local_30,"InitGameDialog","Dialog",0);
  QWidget::setWindowTitle((QString *)InitGameDialog);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = this->player1Label;
  QCoreApplication::translate((char *)&local_30,"InitGameDialog","Player1:",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = this->player2Label;
  QCoreApplication::translate((char *)&local_30,"InitGameDialog","Player2:",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = this->label;
  QCoreApplication::translate((char *)&local_30,"InitGameDialog","Grid size:",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

void retranslateUi(QDialog *InitGameDialog)
    {
        InitGameDialog->setWindowTitle(QCoreApplication::translate("InitGameDialog", "Dialog", nullptr));
        player1Label->setText(QCoreApplication::translate("InitGameDialog", "Player1:", nullptr));
        player2Label->setText(QCoreApplication::translate("InitGameDialog", "Player2:", nullptr));
        label->setText(QCoreApplication::translate("InitGameDialog", "Grid size:", nullptr));
    }